

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing.hh
# Opt level: O1

void __thiscall Parsing::MalformedXML::MalformedXML(MalformedXML *this,string *file)

{
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"malformed XML","");
  Typelib::ImportError::ImportError(&this->super_ImportError,(string *)file,(string *)local_40,0,0);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  *(undefined ***)this = &PTR__ImportError_00113830;
  return;
}

Assistant:

MalformedXML(const std::string& file = "")
            : ImportError(file, "malformed XML") {}